

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int dwarf_get_macro_op(Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
                      Dwarf_Unsigned *op_start_section_offset,Dwarf_Half *macro_operator,
                      Dwarf_Half *forms_count,Dwarf_Small **formcode_array,Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_Macro_Operator_s *pDVar2;
  Dwarf_Macro_Forms_s *pDVar3;
  char *msg;
  Dwarf_Small *pDVar4;
  Dwarf_Debug dbg;
  char buf [50];
  dwarfstring_s dStack_88;
  char local_68 [64];
  
  if (macro_context == (Dwarf_Macro_Context)0x0) {
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    dbg = macro_context->mc_dbg;
    if (macro_context->mc_sentinel == 0xada) {
      if (macro_context->mc_macro_ops_count <= op_number) {
        _dwarf_error(dbg,error,0x143);
        return 1;
      }
      pDVar2 = macro_context->mc_ops;
      bVar1 = pDVar2[op_number].mo_opcode;
      if (bVar1 != 0) {
        pDVar4 = pDVar2[op_number].mo_data +
                 macro_context->mc_section_offset + ~(ulong)macro_context->mc_macro_header;
        if ((Dwarf_Small *)macro_context->mc_section_size <= pDVar4) {
          dwarfstring_constructor_static(&dStack_88,local_68,0x32);
          dwarfstring_append_printf_u
                    (&dStack_88,"DW_DLE_MACRO_OFFSET_BAD: offset 0x%lx",(dwarfstring_u)pDVar4);
          dwarfstring_append_printf_u
                    (&dStack_88," >= section size of 0x%lx",macro_context->mc_section_size);
          msg = dwarfstring_string(&dStack_88);
          _dwarf_error_string(dbg,error,0x13e,msg);
          dwarfstring_destructor(&dStack_88);
          return 1;
        }
        *op_start_section_offset = (Dwarf_Unsigned)pDVar4;
        *macro_operator = (ushort)bVar1;
        pDVar3 = pDVar2[op_number].mo_form;
        if (pDVar3 == (Dwarf_Macro_Forms_s *)0x0) {
          *forms_count = 0;
          pDVar4 = (Dwarf_Small *)0x0;
        }
        else {
          *forms_count = (ushort)pDVar3->mf_formcount;
          pDVar4 = pDVar3->mf_formbytes;
        }
        *formcode_array = pDVar4;
        return 0;
      }
      *op_start_section_offset =
           (macro_context->mc_section_offset + macro_context->mc_total_length) - 1;
      *macro_operator = 0;
      *forms_count = 0;
      *formcode_array = (Dwarf_Small *)0x0;
      return 0;
    }
  }
  _dwarf_error_string(dbg,error,0x142,
                      "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
  return 1;
}

Assistant:

int
dwarf_get_macro_op(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned op_number,
    Dwarf_Unsigned * op_start_section_offset,
    Dwarf_Half    * macro_operator,
    Dwarf_Half    * forms_count,
    const Dwarf_Small **   formcode_array,
    Dwarf_Error *error)
{
    struct Dwarf_Macro_Operator_s *curop = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned op_offset = 0;
    Dwarf_Half operator = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    operator = curop->mo_opcode;
    if (!operator) {
        /*  For the null byte at the end
            of an operator list.  */
        *op_start_section_offset = macro_context->mc_total_length+
            macro_context->mc_section_offset -1;
        *macro_operator = operator;
        *forms_count  = 0;
        *formcode_array = 0;
        return DW_DLV_OK;
    }
    op_offset =
        ((curop->mo_data -1) - macro_context->mc_macro_header) +
        macro_context->mc_section_offset;
    if (op_offset >= macro_context->mc_section_size) {
        dwarfstring m;
        char buf[50];

        dwarfstring_constructor_static(&m,buf,sizeof(buf));
        dwarfstring_append_printf_u(&m,
            "DW_DLE_MACRO_OFFSET_BAD: offset 0x%lx",
            op_offset);
        dwarfstring_append_printf_u(&m,
            " >= section size of 0x%lx",
            macro_context->mc_section_size);
        _dwarf_error_string(dbg,error,DW_DLE_MACRO_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    *op_start_section_offset = op_offset;
    *macro_operator = operator;
    if (curop->mo_form) {
        *forms_count  = curop->mo_form->mf_formcount;
        *formcode_array = curop->mo_form->mf_formbytes;
    } else {
        /* ASSERT: macro_operator == 0 */
        *forms_count  = 0;
        *formcode_array = 0;
    }
    return DW_DLV_OK;
}